

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::ProducerIPCService::RemoteProducer::RemoteProducer(RemoteProducer *this)

{
  function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetAsyncCommandResponse>)>
  local_30;
  RemoteProducer *local_10;
  RemoteProducer *this_local;
  
  local_10 = this;
  Producer::Producer(&this->super_Producer);
  (this->super_Producer)._vptr_Producer = (_func_int **)&PTR__RemoteProducer_009c3dd8;
  ::std::unique_ptr<perfetto::ProducerEndpoint,std::default_delete<perfetto::ProducerEndpoint>>::
  unique_ptr<std::default_delete<perfetto::ProducerEndpoint>,void>
            ((unique_ptr<perfetto::ProducerEndpoint,std::default_delete<perfetto::ProducerEndpoint>>
              *)&this->service_endpoint);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetAsyncCommandResponse>)>::
  function(&local_30,(nullptr_t)0x0);
  ipc::Deferred<perfetto::protos::gen::GetAsyncCommandResponse>::Deferred
            (&this->async_producer_commands,&local_30);
  std::function<void_(perfetto::ipc::AsyncResult<perfetto::protos::gen::GetAsyncCommandResponse>)>::
  ~function(&local_30);
  this->send_setup_tracing_on_async_commands_bound = false;
  return;
}

Assistant:

ProducerIPCService::RemoteProducer::RemoteProducer() = default;